

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_server.cpp
# Opt level: O3

InitializeResult * __thiscall
lscpp::my_lsp_server::initialize
          (InitializeResult *__return_storage_ptr__,my_lsp_server *this,InitializeParams *params)

{
  undefined2 local_bf;
  undefined1 local_bd;
  undefined1 local_b6;
  undefined2 local_b3;
  undefined1 local_b1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  char local_88;
  WorkDoneProgressOptions local_80;
  long *local_78;
  long local_70;
  long local_68 [2];
  char local_58;
  undefined2 local_50;
  byte local_48;
  undefined1 local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  local_48 = 0;
  local_40 = 0;
  local_a0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88 = '\x01';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  (__return_storage_ptr__->capabilities).hoverProvider = true;
  (__return_storage_ptr__->capabilities).definitionProvider = true;
  (__return_storage_ptr__->capabilities).textDocumentSync.
  super__Optional_base<lscpp::protocol::TextDocumentSyncOptions,_true,_true>._M_payload.
  super__Optional_payload_base<lscpp::protocol::TextDocumentSyncOptions>._M_payload._M_value.
  openClose = true;
  *(undefined2 *)
   ((long)&(__return_storage_ptr__->capabilities).textDocumentSync.
           super__Optional_base<lscpp::protocol::TextDocumentSyncOptions,_true,_true>._M_payload.
           super__Optional_payload_base<lscpp::protocol::TextDocumentSyncOptions>._M_payload + 1) =
       local_bf;
  *(undefined1 *)
   ((long)&(__return_storage_ptr__->capabilities).textDocumentSync.
           super__Optional_base<lscpp::protocol::TextDocumentSyncOptions,_true,_true>._M_payload.
           super__Optional_payload_base<lscpp::protocol::TextDocumentSyncOptions>._M_payload + 3) =
       local_bd;
  (__return_storage_ptr__->capabilities).textDocumentSync.
  super__Optional_base<lscpp::protocol::TextDocumentSyncOptions,_true,_true>._M_payload.
  super__Optional_payload_base<lscpp::protocol::TextDocumentSyncOptions>._M_payload._M_value.change
       = Full;
  *(undefined2 *)
   ((long)&(__return_storage_ptr__->capabilities).textDocumentSync.
           super__Optional_base<lscpp::protocol::TextDocumentSyncOptions,_true,_true>._M_payload.
           super__Optional_payload_base<lscpp::protocol::TextDocumentSyncOptions>._M_payload + 8) =
       0;
  *(undefined1 *)
   &(__return_storage_ptr__->capabilities).textDocumentSync.
    super__Optional_base<lscpp::protocol::TextDocumentSyncOptions,_true,_true>._M_payload.
    super__Optional_payload_base<lscpp::protocol::TextDocumentSyncOptions>._M_payload._M_value.save.
    super__Optional_base<lscpp::protocol::SaveOptions,_true,_true> = local_b6;
  *(undefined2 *)
   ((long)&(__return_storage_ptr__->capabilities).textDocumentSync.
           super__Optional_base<lscpp::protocol::TextDocumentSyncOptions,_true,_true>._M_payload.
           super__Optional_payload_base<lscpp::protocol::TextDocumentSyncOptions>._M_payload.
           _M_value.save + 1) = 0x100;
  *(undefined2 *)
   &(__return_storage_ptr__->capabilities).textDocumentSync.
    super__Optional_base<lscpp::protocol::TextDocumentSyncOptions,_true,_true>._M_payload.
    super__Optional_payload_base<lscpp::protocol::TextDocumentSyncOptions>.field_0xd = local_b3;
  (__return_storage_ptr__->capabilities).textDocumentSync.
  super__Optional_base<lscpp::protocol::TextDocumentSyncOptions,_true,_true>._M_payload.
  super__Optional_payload_base<lscpp::protocol::TextDocumentSyncOptions>.field_0xf = local_b1;
  (__return_storage_ptr__->capabilities).completionProvider.
  super__Optional_base<lscpp::protocol::CompletionOptions,_false,_false>._M_payload.
  super__Optional_payload<lscpp::protocol::CompletionOptions,_true,_false,_false>.
  super__Optional_payload_base<lscpp::protocol::CompletionOptions>._M_engaged = false;
  (__return_storage_ptr__->capabilities).completionProvider.
  super__Optional_base<lscpp::protocol::CompletionOptions,_false,_false>._M_payload.
  super__Optional_payload<lscpp::protocol::CompletionOptions,_true,_false,_false>.
  super__Optional_payload_base<lscpp::protocol::CompletionOptions>._M_payload._M_value.
  resolveProvider = false;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&(__return_storage_ptr__->capabilities).completionProvider.
                      super__Optional_base<lscpp::protocol::CompletionOptions,_false,_false>.
                      _M_payload.
                      super__Optional_payload<lscpp::protocol::CompletionOptions,_true,_false,_false>
                      .super__Optional_payload_base<lscpp::protocol::CompletionOptions>._M_payload +
              8),&local_a0);
  (__return_storage_ptr__->capabilities).completionProvider.
  super__Optional_base<lscpp::protocol::CompletionOptions,_false,_false>._M_payload.
  super__Optional_payload<lscpp::protocol::CompletionOptions,_true,_false,_false>.
  super__Optional_payload_base<lscpp::protocol::CompletionOptions>._M_engaged = true;
  (__return_storage_ptr__->capabilities).diagnosticProvider.
  super__Optional_base<lscpp::protocol::DiagnosticOptions,_false,_false>._M_payload.
  super__Optional_payload<lscpp::protocol::DiagnosticOptions,_true,_false,_false>.
  super__Optional_payload_base<lscpp::protocol::DiagnosticOptions>._M_engaged = false;
  if ((local_48 & 1) != 0) {
    (__return_storage_ptr__->capabilities).diagnosticProvider.
    super__Optional_base<lscpp::protocol::DiagnosticOptions,_false,_false>._M_payload.
    super__Optional_payload<lscpp::protocol::DiagnosticOptions,_true,_false,_false>.
    super__Optional_payload_base<lscpp::protocol::DiagnosticOptions>._M_payload._M_value.
    super_WorkDoneProgressOptions.workDoneProgress = local_80.workDoneProgress;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->capabilities).diagnosticProvider.
             super__Optional_base<lscpp::protocol::DiagnosticOptions,_false,_false>._M_payload.
             super__Optional_payload<lscpp::protocol::DiagnosticOptions,_true,_false,_false>.
             super__Optional_payload_base<lscpp::protocol::DiagnosticOptions>._M_payload + 0x28) = 0
    ;
    if (local_58 == '\x01') {
      *(undefined1 **)
       ((long)&(__return_storage_ptr__->capabilities).diagnosticProvider.
               super__Optional_base<lscpp::protocol::DiagnosticOptions,_false,_false>._M_payload.
               super__Optional_payload<lscpp::protocol::DiagnosticOptions,_true,_false,_false>.
               super__Optional_payload_base<lscpp::protocol::DiagnosticOptions>._M_payload + 8) =
           (undefined1 *)
           ((long)&(__return_storage_ptr__->capabilities).diagnosticProvider.
                   super__Optional_base<lscpp::protocol::DiagnosticOptions,_false,_false>._M_payload
                   .super__Optional_payload<lscpp::protocol::DiagnosticOptions,_true,_false,_false>.
                   super__Optional_payload_base<lscpp::protocol::DiagnosticOptions>._M_payload +
           0x18);
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&(__return_storage_ptr__->capabilities).diagnosticProvider.
                         super__Optional_base<lscpp::protocol::DiagnosticOptions,_false,_false>.
                         _M_payload.
                         super__Optional_payload<lscpp::protocol::DiagnosticOptions,_true,_false,_false>
                         .super__Optional_payload_base<lscpp::protocol::DiagnosticOptions>.
                         _M_payload + 8),local_78,local_70 + (long)local_78);
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->capabilities).diagnosticProvider.
               super__Optional_base<lscpp::protocol::DiagnosticOptions,_false,_false>._M_payload.
               super__Optional_payload<lscpp::protocol::DiagnosticOptions,_true,_false,_false>.
               super__Optional_payload_base<lscpp::protocol::DiagnosticOptions>._M_payload + 0x28) =
           1;
    }
    *(undefined2 *)
     ((long)&(__return_storage_ptr__->capabilities).diagnosticProvider.
             super__Optional_base<lscpp::protocol::DiagnosticOptions,_false,_false>._M_payload.
             super__Optional_payload<lscpp::protocol::DiagnosticOptions,_true,_false,_false>.
             super__Optional_payload_base<lscpp::protocol::DiagnosticOptions>._M_payload + 0x30) =
         local_50;
    (__return_storage_ptr__->capabilities).diagnosticProvider.
    super__Optional_base<lscpp::protocol::DiagnosticOptions,_false,_false>._M_payload.
    super__Optional_payload<lscpp::protocol::DiagnosticOptions,_true,_false,_false>.
    super__Optional_payload_base<lscpp::protocol::DiagnosticOptions>._M_engaged = true;
  }
  if (((local_48 & 1) != 0) && (local_48 = 0, local_58 == '\x01')) {
    local_58 = '\0';
    if (local_78 != local_68) {
      operator_delete(local_78,local_68[0] + 1);
    }
  }
  if (local_88 == '\x01') {
    local_88 = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

protocol::InitializeResult
  initialize(const protocol::InitializeParams &params) override {
    protocol::ServerCapabilities capabilites;
    capabilites.hoverProvider = true;
    capabilites.completionProvider = protocol::CompletionOptions{};
    capabilites.definitionProvider = true;
    protocol::TextDocumentSyncOptions sync;
    sync.openClose = true;
    sync.change = protocol::TextDocumentSyncKind::Full;
    capabilites.textDocumentSync = sync;
    protocol::InitializeResult result{capabilites};
    return result;
  }